

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_cid.c
# Opt level: O1

int quicly_remote_cid_register
              (quicly_remote_cid_set_t *set,uint64_t sequence,uint8_t *cid,size_t cid_len,
              uint8_t *srt,uint64_t retire_prior_to,uint64_t *unregistered_seqs,
              size_t *num_unregistered_seqs)

{
  uint8_t *puVar1;
  ulong uVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  undefined4 uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint64_t *puVar16;
  size_t idx_to_unreg;
  long lVar17;
  size_t sVar18;
  size_t sVar19;
  quicly_remote_cid_t backup_cid;
  
  iVar11 = set->cids[0].is_active;
  uVar12 = *(undefined4 *)&set->cids[0].field_0x4;
  uVar4 = set->cids[0].sequence;
  uVar5 = *(undefined8 *)set->cids[0].cid.cid;
  uVar6 = *(undefined8 *)(set->cids[0].cid.cid + 8);
  uVar7 = *(undefined8 *)(set->cids[0].cid.cid + 0x10);
  uVar8 = *(undefined8 *)(set->cids[0].stateless_reset_token + 3);
  uVar9 = *(undefined8 *)(set->cids[0].stateless_reset_token + 0xb);
  if (sequence < retire_prior_to) {
    __assert_fail("sequence >= retire_prior_to",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/remote_cid.c"
                  ,0xba,
                  "int quicly_remote_cid_register(quicly_remote_cid_set_t *, uint64_t, const uint8_t *, size_t, const uint8_t *, uint64_t, uint64_t *, size_t *)"
                 );
  }
  puVar16 = &set->cids[0].sequence;
  sVar18 = 0xffffffffffffffff;
  idx_to_unreg = 0;
  sVar19 = 0;
  uVar14 = 0xffffffffffffffff;
  do {
    uVar15 = uVar14;
    if (((quicly_remote_cid_t *)(puVar16 + -1))->is_active != 0) {
      uVar2 = *puVar16;
      if (uVar2 < retire_prior_to) {
        unregistered_seqs[sVar19] = uVar2;
        sVar19 = sVar19 + 1;
        do_unregister(set,idx_to_unreg);
      }
      else {
        if (uVar2 <= uVar14) {
          uVar15 = uVar2;
        }
        if (uVar2 < uVar14) {
          sVar18 = idx_to_unreg;
        }
      }
    }
    idx_to_unreg = idx_to_unreg + 1;
    puVar16 = puVar16 + 7;
    uVar14 = uVar15;
  } while (idx_to_unreg != 4);
  if ((set->cids[0].is_active == 0) && (sVar18 != 0xffffffffffffffff)) {
    promote_cid(set,sVar18);
  }
  *num_unregistered_seqs = sVar19;
  bVar10 = false;
  if (set->_largest_sequence_expected < sequence) {
    iVar13 = 0x20009;
  }
  else {
    lVar17 = 0;
    sVar18 = 0;
    do {
      if (*(int *)(set->cids[0].cid.cid + lVar17 + -0x10) != 0) {
        if ((set->cids[0].cid.cid[lVar17 + 0x14] == cid_len) &&
           (iVar13 = bcmp(set->cids[0].cid.cid + lVar17,cid,cid_len), iVar13 == 0)) {
          if ((*(uint64_t *)(set->cids[0].cid.cid + lVar17 + -8) == sequence) &&
             (*(undefined1 (*) [16])(set->cids[0].stateless_reset_token + lVar17) ==
              *(undefined1 (*) [16])srt)) break;
        }
        else if (*(uint64_t *)(set->cids[0].cid.cid + lVar17 + -8) != sequence) goto LAB_0012f93d;
        iVar13 = 0x2000a;
        bVar10 = false;
        goto LAB_0012f97f;
      }
      if (*(uint64_t *)(set->cids[0].cid.cid + lVar17 + -8) == sequence) {
        if (bVar10) {
          __assert_fail("!was_stored",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/remote_cid.c"
                        ,0x60,
                        "int do_register(quicly_remote_cid_set_t *, uint64_t, const uint8_t *, size_t, const uint8_t *)"
                       );
        }
        puVar1 = set->cids[0].cid.cid + lVar17 + -0x10;
        *(uint64_t *)(puVar1 + 8) = sequence;
        memcpy(puVar1 + 0x10,cid,cid_len);
        puVar1[0x24] = (char)cid_len;
        uVar3 = *(undefined8 *)(srt + 8);
        *(undefined8 *)(puVar1 + 0x25) = *(undefined8 *)srt;
        *(undefined8 *)(puVar1 + 0x2d) = uVar3;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        bVar10 = true;
        if ((lVar17 != 0) && (set->cids[0].is_active == 0)) {
          promote_cid(set,sVar18);
        }
      }
LAB_0012f93d:
      sVar18 = sVar18 + 1;
      lVar17 = lVar17 + 0x38;
    } while (lVar17 != 0xe0);
    iVar13 = 0;
    bVar10 = true;
  }
LAB_0012f97f:
  if ((!bVar10) && (set->cids[0].is_active == 0)) {
    *(undefined8 *)(set->cids[0].cid.cid + 8) = uVar6;
    *(undefined8 *)(set->cids[0].cid.cid + 0x10) = uVar7;
    *(undefined8 *)(set->cids[0].stateless_reset_token + 3) = uVar8;
    *(undefined8 *)(set->cids[0].stateless_reset_token + 0xb) = uVar9;
    set->cids[0].is_active = iVar11;
    *(undefined4 *)&set->cids[0].field_0x4 = uVar12;
    set->cids[0].sequence = uVar4;
    *(undefined8 *)set->cids[0].cid.cid = uVar5;
    *(undefined8 *)(set->cids[0].cid.cid + 8) = uVar6;
  }
  return iVar13;
}

Assistant:

int quicly_remote_cid_register(quicly_remote_cid_set_t *set, uint64_t sequence, const uint8_t *cid, size_t cid_len,
                               const uint8_t srt[QUICLY_STATELESS_RESET_TOKEN_LEN], uint64_t retire_prior_to,
                               uint64_t unregistered_seqs[QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT], size_t *num_unregistered_seqs)
{
    quicly_remote_cid_t backup_cid = set->cids[0]; // preserve one valid entry in cids[0] to handle protocol violation
    int ret;

    assert(sequence >= retire_prior_to);

    /* First, handle retire_prior_to. This order is important as it is possible to receive a NEW_CONNECTION_ID frame such that it
     * retires active_connection_id_limit CIDs and then installs one new CID. */
    *num_unregistered_seqs = unregister_prior_to(set, retire_prior_to, unregistered_seqs);

    /* Then, register given value. */
    if ((ret = do_register(set, sequence, cid, cid_len, srt)) != 0) {
        /* restore the backup and send the error */
        if (!set->cids[0].is_active)
            set->cids[0] = backup_cid;
        return ret;
    }

    return ret;
}